

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

object __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
          (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
           *this,float *args,float *args_1,float *args_2)

{
  int iVar1;
  float *in_R8;
  object local_30;
  
  iVar1 = PyGILState_Check();
  if (iVar1 != 0) {
    make_tuple<(pybind11::return_value_policy)1,float_const&,float_const&,float_const&>
              ((pybind11 *)&local_30,args_1,args_2,in_R8);
    accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)args);
    simple_collector<(pybind11::return_value_policy)1>::call
              ((simple_collector<(pybind11::return_value_policy)1> *)this,(PyObject *)&local_30);
    object::~object(&local_30);
    return (object)(handle)this;
  }
  pybind11_fail("pybind11::object_api<>::operator() PyGILState_Check() failure.");
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
#if !defined(NDEBUG) && PY_VERSION_HEX >= 0x03060000
    if (!PyGILState_Check()) {
        pybind11_fail("pybind11::object_api<>::operator() PyGILState_Check() failure.");
    }
#endif
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}